

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeout.c
# Opt level: O0

int wiz_timeout_queue(void)

{
  nh_menuitem *pnVar1;
  nh_menuitem *_item__3;
  nh_menuitem *_item__2;
  nh_menuitem *_item__1;
  nh_menuitem *_item_;
  menulist menu;
  char buf [256];
  
  init_menulist((menulist *)&_item_);
  sprintf((char *)&menu.size,"Current time = %u.",(ulong)moves);
  if ((int)menu.items <= menu.items._4_4_) {
    menu.items._0_4_ = (int)menu.items << 1;
    _item_ = (nh_menuitem *)realloc(_item_,(long)(int)menu.items * 0x10c);
  }
  pnVar1 = _item_ + menu.items._4_4_;
  pnVar1->id = 0;
  pnVar1->role = MI_TEXT;
  pnVar1->accel = '\0';
  pnVar1->group_accel = '\0';
  pnVar1->selected = '\0';
  strcpy(pnVar1->caption,(char *)&menu.size);
  menu.items._4_4_ = menu.items._4_4_ + 1;
  if ((int)menu.items <= menu.items._4_4_) {
    menu.items._0_4_ = (int)menu.items << 1;
    _item_ = (nh_menuitem *)realloc(_item_,(long)(int)menu.items * 0x10c);
  }
  pnVar1 = _item_ + menu.items._4_4_;
  pnVar1->id = 0;
  pnVar1->role = MI_TEXT;
  pnVar1->accel = '\0';
  pnVar1->group_accel = '\0';
  pnVar1->selected = '\0';
  strcpy(pnVar1->caption,"");
  menu.items._4_4_ = menu.items._4_4_ + 1;
  if ((int)menu.items <= menu.items._4_4_) {
    menu.items._0_4_ = (int)menu.items << 1;
    _item_ = (nh_menuitem *)realloc(_item_,(long)(int)menu.items * 0x10c);
  }
  pnVar1 = _item_ + menu.items._4_4_;
  pnVar1->id = 0;
  pnVar1->role = MI_TEXT;
  pnVar1->accel = '\0';
  pnVar1->group_accel = '\0';
  pnVar1->selected = '\0';
  strcpy(pnVar1->caption,"Active timeout queue:");
  menu.items._4_4_ = menu.items._4_4_ + 1;
  if ((int)menu.items <= menu.items._4_4_) {
    menu.items._0_4_ = (int)menu.items << 1;
    _item_ = (nh_menuitem *)realloc(_item_,(long)(int)menu.items * 0x10c);
  }
  pnVar1 = _item_ + menu.items._4_4_;
  pnVar1->id = 0;
  pnVar1->role = MI_TEXT;
  pnVar1->accel = '\0';
  pnVar1->group_accel = '\0';
  pnVar1->selected = '\0';
  strcpy(pnVar1->caption,"");
  menu.items._4_4_ = menu.items._4_4_ + 1;
  print_queue((menulist *)&_item_,level->lev_timers);
  display_menu(_item_,menu.items._4_4_,(char *)0x0,0,(int *)0x0);
  free(_item_);
  return 0;
}

Assistant:

int wiz_timeout_queue(void)
{
    char buf[BUFSZ];
    struct menulist menu;

    init_menulist(&menu);

    sprintf(buf, "Current time = %u.", moves);
    add_menutext(&menu, buf);
    add_menutext(&menu, "");
    add_menutext(&menu, "Active timeout queue:");
    add_menutext(&menu, "");
    print_queue(&menu, level->lev_timers);

    display_menu(menu.items, menu.icount, NULL, PICK_NONE, NULL);
    free(menu.items);

    return 0;
}